

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayOperations.cc
# Opt level: O0

int normaliseArray(double *inputVector,uint *outputVector,int vectorLength)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  int in_EDX;
  long in_RSI;
  double *in_RDI;
  double dVar3;
  int i_1;
  int currentValue;
  int i;
  int minVal;
  int *tempVector;
  int maxVal;
  int local_30;
  int local_28;
  int local_24;
  int local_18;
  
  local_18 = 0;
  if (0 < in_EDX) {
    __ptr = calloc((long)in_EDX,4);
    dVar3 = floor(*in_RDI);
    local_24 = (int)dVar3;
    dVar3 = floor(*in_RDI);
    local_18 = (int)dVar3;
    for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
      dVar3 = floor(in_RDI[local_28]);
      iVar2 = (int)dVar3;
      *(int *)((long)__ptr + (long)local_28 * 4) = iVar2;
      iVar1 = iVar2;
      if ((local_24 <= iVar2) && (iVar1 = local_24, local_18 < iVar2)) {
        local_18 = iVar2;
      }
      local_24 = iVar1;
    }
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      *(int *)(in_RSI + (long)local_30 * 4) = *(int *)((long)__ptr + (long)local_30 * 4) - local_24;
    }
    local_18 = (local_18 - local_24) + 1;
    free(__ptr);
  }
  return local_18;
}

Assistant:

int normaliseArray(double *inputVector, uint *outputVector, int vectorLength) {
    int maxVal = 0;

    if (vectorLength > 0) {
        int* tempVector = (int*) calloc(vectorLength,sizeof(int));
        int minVal = (int) floor(inputVector[0]);
        maxVal = (int) floor(inputVector[0]);

        for (int i = 0; i < vectorLength; i++) {
            int currentValue = (int) floor(inputVector[i]);
            tempVector[i] = currentValue;

            if (currentValue < minVal) {
                minVal = currentValue;
            } else if (currentValue > maxVal) {
                maxVal = currentValue;
            }
        }/*for loop over vector*/

        for (int i = 0; i < vectorLength; i++) {
            outputVector[i] = tempVector[i] - minVal;
        }

        maxVal = (maxVal - minVal) + 1;

        free(tempVector);
        
    }

    return maxVal;
}